

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ActivationSoftsign * __thiscall
CoreML::Specification::ActivationParams::mutable_softsign(ActivationParams *this)

{
  bool bVar1;
  ActivationSoftsign *this_00;
  ActivationParams *this_local;
  
  bVar1 = has_softsign(this);
  if (!bVar1) {
    clear_NonlinearityType(this);
    set_has_softsign(this);
    this_00 = (ActivationSoftsign *)operator_new(0x18);
    ActivationSoftsign::ActivationSoftsign(this_00);
    (this->NonlinearityType_).softsign_ = this_00;
  }
  return (ActivationSoftsign *)(this->NonlinearityType_).linear_;
}

Assistant:

inline ::CoreML::Specification::ActivationSoftsign* ActivationParams::mutable_softsign() {
  if (!has_softsign()) {
    clear_NonlinearityType();
    set_has_softsign();
    NonlinearityType_.softsign_ = new ::CoreML::Specification::ActivationSoftsign;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ActivationParams.softsign)
  return NonlinearityType_.softsign_;
}